

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.c
# Opt level: O1

void wp_trace_pool_insert_data
               (wp_trace_idx *idx_pool,void *data_pool,size_t pool_capacity,size_t data_size,
               void *key,void *data)

{
  int *piVar1;
  
  if (idx_pool == (wp_trace_idx *)0x0) {
    w_handle_failed_assertion
              ("idx_pool != NULL","wp_trace_pool_insert_data",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/trace.c"
               ,0x19);
  }
  if (data_pool == (void *)0x0) {
    w_handle_failed_assertion
              ("data_pool != NULL","wp_trace_pool_insert_data",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/trace.c"
               ,0x1a);
  }
  if (key == (void *)0x0) {
    w_handle_failed_assertion
              ("key != NULL","wp_trace_pool_insert_data",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/trace.c"
               ,0x1b);
  }
  if (data == (void *)0x0) {
    w_handle_failed_assertion
              ("data != NULL","wp_trace_pool_insert_data",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/trace.c"
               ,0x1c);
  }
  if (pool_capacity != 0) {
    piVar1 = &idx_pool->valid;
    do {
      if (*piVar1 == 0) {
        ((wp_trace_idx *)(piVar1 + -2))->key = key;
        *piVar1 = 1;
        w_copy_mem(data_pool,data,data_size);
        return;
      }
      data_pool = (void *)((long)data_pool + data_size);
      piVar1 = piVar1 + 4;
      pool_capacity = pool_capacity - 1;
    } while (pool_capacity != 0);
  }
  w_handle_failed_assertion
            ("0","wp_trace_pool_insert_data",
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/trace.c"
             ,0x30);
  return;
}

Assistant:

void
wp_trace_pool_insert_data(
    struct wp_trace_idx *idx_pool,
    void *data_pool,
    size_t pool_capacity,
    size_t data_size,
    const void *key,
    const void *data
)
{
    size_t i;

    W_ASSERT(idx_pool != NULL);
    W_ASSERT(data_pool != NULL);
    W_ASSERT(key != NULL);
    W_ASSERT(data != NULL);

    for (i = 0; i < pool_capacity; ++i)
    {
        struct wp_trace_idx *idx;

        idx = &idx_pool[i];
        if (!idx->valid)
        {
            void *data_it;

            data_it = (void *)((uintptr_t)data_pool + data_size * i);

            idx->key = key;
            idx->valid = 1;
            w_copy_mem(data_it, data, data_size);
            return;
        }
    }

    W_ASSERT(0);
}